

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

word Abc_Tt6IsopCover(word uOn,word uOnDc,int nVars,int *pCover,int *pnCubes)

{
  int iVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  word uOnDc_00;
  word uOnDc_01;
  word wVar5;
  word wVar6;
  int nEnd1;
  int nEnd0;
  int nBeg0;
  int Var;
  int c;
  word uRes2;
  word uRes1;
  word uRes0;
  word uOnDc1;
  word uOnDc0;
  word uOn1;
  word uOn0;
  int *pnCubes_local;
  int *pCover_local;
  int nVars_local;
  word uOnDc_local;
  word uOn_local;
  
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x986,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
  }
  if ((uOn & (uOnDc ^ 0xffffffffffffffff)) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x987,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
  }
  if (uOn == 0) {
    uOn_local = 0;
  }
  else if (uOnDc == 0xffffffffffffffff) {
    iVar2 = *pnCubes;
    *pnCubes = iVar2 + 1;
    pCover[iVar2] = 0;
    uOn_local = 0xffffffffffffffff;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x98f,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
    nEnd0 = nVars + -1;
    while (((-1 < nEnd0 && (iVar2 = Abc_Tt6HasVar(uOn,nEnd0), iVar2 == 0)) &&
           (iVar2 = Abc_Tt6HasVar(uOnDc,nEnd0), iVar2 == 0))) {
      nEnd0 = nEnd0 + -1;
    }
    if (nEnd0 < 0) {
      __assert_fail("Var >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x994,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
    wVar3 = Abc_Tt6Cofactor0(uOn,nEnd0);
    wVar4 = Abc_Tt6Cofactor1(uOn,nEnd0);
    uOnDc_00 = Abc_Tt6Cofactor0(uOnDc,nEnd0);
    uOnDc_01 = Abc_Tt6Cofactor1(uOnDc,nEnd0);
    nBeg0 = *pnCubes;
    wVar5 = Abc_Tt6IsopCover(wVar3 & (uOnDc_01 ^ 0xffffffffffffffff),uOnDc_00,nEnd0,pCover,pnCubes);
    iVar2 = *pnCubes;
    wVar6 = Abc_Tt6IsopCover(wVar4 & (uOnDc_00 ^ 0xffffffffffffffff),uOnDc_01,nEnd0,pCover,pnCubes);
    iVar1 = *pnCubes;
    wVar3 = Abc_Tt6IsopCover(wVar3 & (wVar5 ^ 0xffffffffffffffff) |
                             wVar4 & (wVar6 ^ 0xffffffffffffffff),uOnDc_00 & uOnDc_01,nEnd0,pCover,
                             pnCubes);
    uOn_local = wVar5 & s_Truths6Neg[nEnd0] | wVar6 & s_Truths6[nEnd0] | wVar3;
    for (; nBeg0 < iVar2; nBeg0 = nBeg0 + 1) {
      pCover[nBeg0] = 1 << ((byte)(nEnd0 << 1) & 0x1f) | pCover[nBeg0];
    }
    while (nBeg0 = iVar2, nBeg0 < iVar1) {
      pCover[nBeg0] = 1 << ((char)(nEnd0 << 1) + 1U & 0x1f) | pCover[nBeg0];
      iVar2 = nBeg0 + 1;
    }
    if ((uOn & (uOn_local ^ 0xffffffffffffffff)) != 0) {
      __assert_fail("(uOn & ~uRes2) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x9a7,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
    if ((uOn_local & (uOnDc ^ 0xffffffffffffffff)) != 0) {
      __assert_fail("(uRes2 & ~uOnDc) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x9a8,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
  }
  return uOn_local;
}

Assistant:

static inline word Abc_Tt6IsopCover( word uOn, word uOnDc, int nVars, int * pCover, int * pnCubes )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int c, Var, nBeg0, nEnd0, nEnd1;
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
        return 0;
    if ( uOnDc == ~(word)0 )
    {
        pCover[(*pnCubes)++] = 0;
        return ~(word)0;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    nBeg0 = *pnCubes; 
    uRes0 = Abc_Tt6IsopCover( uOn0 & ~uOnDc1, uOnDc0, Var, pCover, pnCubes );
    nEnd0 = *pnCubes;
    uRes1 = Abc_Tt6IsopCover( uOn1 & ~uOnDc0, uOnDc1, Var, pCover, pnCubes );
    nEnd1 = *pnCubes;
    uRes2 = Abc_Tt6IsopCover( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pCover, pnCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    for ( c = nBeg0; c < nEnd0; c++ )
        pCover[c] |= (1 << (2*Var+0));
    for ( c = nEnd0; c < nEnd1; c++ )
        pCover[c] |= (1 << (2*Var+1));
    assert( (uOn & ~uRes2) == 0 );
    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}